

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O1

void __thiscall MyJXSDescriptor::FillDescriptor(MyJXSDescriptor *this,MXFReader *Reader)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  MDD_t MVar3;
  undefined8 *puVar4;
  CDCIEssenceDescriptor *pCVar5;
  RGBAEssenceDescriptor *pRVar6;
  JPEGXSPictureSubDescriptor *pJVar7;
  ILogSink *pIVar8;
  long *plVar9;
  undefined8 uVar10;
  IArchive IVar11;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  UL local_b8;
  Result_t local_98 [104];
  
  MVar3 = ASDCP::DefaultCompositeDict();
  puVar4 = (undefined8 *)ASDCP::Dictionary::Type(MVar3);
  local_b8.super_Identifier<16U>.m_HasValue = true;
  local_b8.super_Identifier<16U>.m_Value._0_7_ = SUB87(*puVar4,0);
  local_b8.super_Identifier<16U>.m_Value[7] = (byte_t)((ulong)*puVar4 >> 0x38);
  local_b8.super_Identifier<16U>.m_Value._8_7_ = SUB87(puVar4[1],0);
  local_b8.super_Identifier<16U>.m_Value[0xf] = (byte_t)((ulong)puVar4[1] >> 0x38);
  local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  pCVar5 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::CDCIEssenceDescriptor>
                     (Reader,&local_b8);
  this->m_CDCIDescriptor = pCVar5;
  MVar3 = ASDCP::DefaultCompositeDict();
  puVar4 = (undefined8 *)ASDCP::Dictionary::Type(MVar3);
  local_b8.super_Identifier<16U>.m_HasValue = true;
  local_b8.super_Identifier<16U>.m_Value._0_7_ = SUB87(*puVar4,0);
  local_b8.super_Identifier<16U>.m_Value[7] = (byte_t)((ulong)*puVar4 >> 0x38);
  local_b8.super_Identifier<16U>.m_Value._8_7_ = SUB87(puVar4[1],0);
  local_b8.super_Identifier<16U>.m_Value[0xf] = (byte_t)((ulong)puVar4[1] >> 0x38);
  local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  pRVar6 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (Reader,&local_b8);
  this->m_RGBADescriptor = pRVar6;
  if ((pRVar6 == (RGBAEssenceDescriptor *)0x0) &&
     (pRVar6 = (RGBAEssenceDescriptor *)this->m_CDCIDescriptor,
     pRVar6 == (RGBAEssenceDescriptor *)0x0)) {
    pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar8,"Picture descriptor not found.\n");
  }
  else {
    (this->m_SampleRate).super_Rational.Numerator = *(i32_t *)(pRVar6 + 0xf0);
    (this->m_SampleRate).super_Rational.Denominator = *(i32_t *)(pRVar6 + 0xf4);
    if (pRVar6[0x100] == (RGBAEssenceDescriptor)0x1) {
      this->ContainerDuration = *(ui64_t *)(pRVar6 + 0xf8);
    }
  }
  MVar3 = ASDCP::DefaultCompositeDict();
  puVar4 = (undefined8 *)ASDCP::Dictionary::Type(MVar3);
  local_b8.super_Identifier<16U>.m_HasValue = true;
  local_b8.super_Identifier<16U>.m_Value._0_7_ = SUB87(*puVar4,0);
  local_b8.super_Identifier<16U>.m_Value[7] = (byte_t)((ulong)*puVar4 >> 0x38);
  local_b8.super_Identifier<16U>.m_Value._8_7_ = SUB87(puVar4[1],0);
  local_b8.super_Identifier<16U>.m_Value[0xf] = (byte_t)((ulong)puVar4[1] >> 0x38);
  local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  pJVar7 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::JPEGXSPictureSubDescriptor>
                     (Reader,&local_b8);
  this->m_JPEGXSSubDescriptor = pJVar7;
  if (pJVar7 == (JPEGXSPictureSubDescriptor *)0x0) {
    pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar8,"JPEGXSPictureSubDescriptor not found.\n");
  }
  local_b8.super_Identifier<16U>.m_HasValue = SUB81(&local_b8,0);
  local_b8.super_Identifier<16U>.m_Value._0_7_ = SUB87((ulong)&local_b8 >> 8,0);
  local_b8.super_Identifier<16U>.m_Value[7] = '\0';
  local_b8.super_Identifier<16U>.m_Value[8] = '\0';
  local_b8.super_Identifier<16U>.m_Value[9] = '\0';
  local_b8.super_Identifier<16U>.m_Value[10] = '\0';
  local_b8.super_Identifier<16U>.m_Value[0xb] = '\0';
  local_b8.super_Identifier<16U>.m_Value[0xc] = '\0';
  local_b8.super_Identifier<16U>.m_Value[0xd] = '\0';
  local_b8.super_Identifier<16U>.m_Value[0xe] = '\0';
  local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive = (_func_int **)&local_b8;
  plVar9 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar3 = ASDCP::DefaultCompositeDict();
  uVar10 = ASDCP::Dictionary::Type(MVar3);
  (**(code **)(*plVar9 + 0xb0))(local_98,plVar9,uVar10,&local_b8);
  Kumu::Result_t::~Result_t(local_98);
  if ((UL *)local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive == &local_b8) {
    pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar8,"MXF Metadata contains no Track Sets.\n");
  }
  p_Var1 = local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive[2];
  (this->m_EditRate).super_Rational.Numerator = *(i32_t *)(p_Var1 + 0x108);
  (this->m_EditRate).super_Rational.Denominator = *(i32_t *)(p_Var1 + 0x10c);
  IVar11._vptr_IArchive = local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive;
  if ((UL *)local_b8.super_Identifier<16U>.super_IArchive._vptr_IArchive != &local_b8) {
    do {
      pp_Var2 = (_func_int **)*IVar11._vptr_IArchive;
      operator_delete(IVar11._vptr_IArchive,0x18);
      IVar11._vptr_IArchive = pp_Var2;
    } while ((UL *)pp_Var2 != &local_b8);
  }
  return;
}

Assistant:

void FillDescriptor(AS_02::JXS::MXFReader& Reader)
  {
    m_CDCIDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, CDCIEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor));

    m_RGBADescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	m_SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else if ( m_CDCIDescriptor != 0 )
      {
    	m_SampleRate = m_CDCIDescriptor->SampleRate;
        if ( ! m_CDCIDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_CDCIDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    m_JPEGXSSubDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, JPEGXSPictureSubDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_JPEGXSPictureSubDescriptor));

    if ( m_JPEGXSSubDescriptor == 0 )
      {
	DefaultLogSink().Error("JPEGXSPictureSubDescriptor not found.\n");
      }

    std::list<InterchangeObject*> ObjectList;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), ObjectList);
    
    if ( ObjectList.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    m_EditRate = ((Track*)ObjectList.front())->EditRate;
  }